

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.h
# Opt level: O0

BSDF * __thiscall
pbrt::SubsurfaceMaterial::GetBSDF<pbrt::UniversalTextureEvaluator>
          (void *param_1,Vector3f *param_2,void *param_3,undefined8 param_4,undefined8 *param_5)

{
  Float eta;
  BxDFHandle *bxdf;
  Vector3f *dpdus;
  undefined1 auVar1 [64];
  TrowbridgeReitzDistribution distrib;
  Float vrough;
  Float urough;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 in_stack_fffffffffffffe98 [64];
  BSDF *n;
  BSDF *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  Float in_stack_ffffffffffffff1c;
  Float in_stack_ffffffffffffff20;
  Float in_stack_ffffffffffffff24;
  TrowbridgeReitzDistribution local_d8;
  TextureEvalContext in_stack_ffffffffffffff30;
  undefined1 local_80 [64];
  Float local_34;
  undefined8 *local_30;
  undefined8 local_28;
  void *local_20;
  Vector3f *local_18;
  void *local_8;
  
  n = (BSDF *)param_1;
  local_30 = param_5;
  local_28 = param_4;
  local_20 = param_3;
  local_18 = param_2;
  local_8 = param_1;
  FloatTextureHandle::FloatTextureHandle
            (in_stack_fffffffffffffe98._8_8_,in_stack_fffffffffffffe98._0_8_);
  memcpy(local_80,local_20,0x40);
  auVar1 = vmovdqu64_avx512f(local_80);
  auVar1 = vmovdqu64_avx512f(auVar1);
  auVar2 = auVar1._0_16_;
  local_34 = UniversalTextureEvaluator::operator()
                       ((UniversalTextureEvaluator *)
                        CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                        (FloatTextureHandle *)
                        CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                        in_stack_ffffffffffffff30);
  FloatTextureHandle::FloatTextureHandle(auVar2._8_8_,auVar2._0_8_);
  memcpy(&stack0xffffffffffffff30,local_20,0x40);
  auVar1 = vmovdqu64_avx512f((undefined1  [64])in_stack_ffffffffffffff30);
  auVar1 = vmovdqu64_avx512f(auVar1);
  auVar3 = auVar1._0_32_;
  UniversalTextureEvaluator::operator()
            ((UniversalTextureEvaluator *)
             CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
             (FloatTextureHandle *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
             in_stack_ffffffffffffff30);
  if (((uint)param_2[5].super_Tuple3<pbrt::Vector3,_float>.z & 1) != 0) {
    local_34 = TrowbridgeReitzDistribution::RoughnessToAlpha(0.0);
    TrowbridgeReitzDistribution::RoughnessToAlpha(0.0);
  }
  auVar2 = auVar3._0_16_;
  TrowbridgeReitzDistribution::TrowbridgeReitzDistribution
            (auVar3._24_8_,auVar3._20_4_,auVar3._16_4_);
  DielectricInterfaceBxDF::DielectricInterfaceBxDF
            ((DielectricInterfaceBxDF *)&stack0xffffffffffffff1c,
             param_2[5].super_Tuple3<pbrt::Vector3,_float>.y,&local_d8);
  *local_30 = CONCAT44(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
  *(Float *)(local_30 + 1) = in_stack_ffffffffffffff24;
  eta = (Float)((ulong)((long)local_20 + 0x4c) >> 0x20);
  bxdf = (BxDFHandle *)((long)local_20 + 0x58);
  dpdus = (Vector3f *)((long)local_20 + 100);
  BxDFHandle::TaggedPointer<pbrt::DielectricInterfaceBxDF>(auVar2._8_8_,auVar2._0_8_);
  BSDF::BSDF(in_stack_ffffffffffffff10,param_2,(Normal3f *)n,(Normal3f *)param_1,dpdus,bxdf,eta);
  return n;
}

Assistant:

PBRT_CPU_GPU BSDF GetBSDF(TextureEvaluator texEval, const MaterialEvalContext &ctx,
                              SampledWavelengths &lambda,
                              DielectricInterfaceBxDF *bxdf) const {
        // Initialize BSDF for _SubsurfaceMaterial_

        Float urough = texEval(uRoughness, ctx), vrough = texEval(vRoughness, ctx);
        if (remapRoughness) {
            urough = TrowbridgeReitzDistribution::RoughnessToAlpha(urough);
            vrough = TrowbridgeReitzDistribution::RoughnessToAlpha(vrough);
        }
        TrowbridgeReitzDistribution distrib(urough, vrough);

        // Initialize _bsdf_ for smooth or rough dielectric
        *bxdf = DielectricInterfaceBxDF(eta, distrib);
        return BSDF(ctx.wo, ctx.n, ctx.ns, ctx.dpdus, bxdf, eta);
    }